

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O2

EVP_PKEY * EVP_PKCS82PKEY(PKCS8_PRIV_KEY_INFO *p8)

{
  uint uVar1;
  EVP_PKEY *pkey;
  uint8_t *der;
  CBS cbs;
  
  der = (uint8_t *)0x0;
  uVar1 = i2d_PKCS8_PRIV_KEY_INFO(p8,&der);
  if ((int)uVar1 < 0) {
    pkey = (EVP_PKEY *)0x0;
  }
  else {
    cbs.len = (size_t)uVar1;
    cbs.data = der;
    pkey = (EVP_PKEY *)EVP_parse_private_key(&cbs);
    if ((pkey == (EVP_PKEY *)0x0) || (cbs.len != 0)) {
      ERR_put_error(0x13,0,0x68,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                    ,0x4a);
      EVP_PKEY_free(pkey);
      pkey = (EVP_PKEY *)0x0;
    }
    OPENSSL_free(der);
  }
  return pkey;
}

Assistant:

EVP_PKEY *EVP_PKCS82PKEY(const PKCS8_PRIV_KEY_INFO *p8) {
  uint8_t *der = NULL;
  int der_len = i2d_PKCS8_PRIV_KEY_INFO(p8, &der);
  if (der_len < 0) {
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, der, (size_t)der_len);
  EVP_PKEY *ret = EVP_parse_private_key(&cbs);
  if (ret == NULL || CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    EVP_PKEY_free(ret);
    OPENSSL_free(der);
    return NULL;
  }

  OPENSSL_free(der);
  return ret;
}